

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlElement.cpp
# Opt level: O2

int libebml::CodedValueLengthSigned(int64 Length,int CodedSize,binary *OutBuffer)

{
  int iVar1;
  ulong Length_00;
  
  Length_00 = Length + 0x3fU;
  if ((((0x7e < Length + 0x3fU) && (Length_00 = Length + 0x1fffU, 0x3ffe < Length + 0x1fffU)) &&
      (Length_00 = Length + 0xfffffU, 0x1ffffe < Length + 0xfffffU)) &&
     (Length_00 = Length, Length + 0x7ffffffU < 0xfffffff)) {
    Length_00 = Length + 0x7ffffffU;
  }
  iVar1 = CodedValueLength(Length_00,CodedSize,OutBuffer);
  return iVar1;
}

Assistant:

int CodedValueLengthSigned(int64 Length, int CodedSize, binary * OutBuffer)
{
  if (Length > -64 && Length < 64) // 2^6
    Length += 63;
  else if (Length > -8192 && Length < 8192) // 2^13
    Length += 8191;
  else if (Length > -1048576L && Length < 1048576L) // 2^20
    Length += 1048575L;
  else if (Length > -134217728L && Length < 134217728L) // 2^27
    Length += 134217727L;

  return CodedValueLength(Length, CodedSize, OutBuffer);
}